

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb_ComputeSumReduction(leb_Heap *leb)

{
  int iVar1;
  leb_Node node;
  leb_Node node_00;
  leb_Node node_01;
  leb_Node node_02;
  leb_Node node_03;
  leb_Node node_04;
  leb_Node node_05;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t x1;
  uint local_60;
  uint32_t x0;
  uint32_t j;
  uint32_t maxNodeID_1;
  uint32_t minNodeID_1;
  uint32_t bitData;
  uint32_t bitField;
  uint local_20;
  uint32_t alignedBitOffset;
  uint32_t nodeID;
  uint32_t maxNodeID;
  uint32_t minNodeID;
  int depth;
  leb_Heap *leb_local;
  
  iVar1 = leb->maxDepth;
  uVar2 = 1 << ((byte)iVar1 & 0x1f);
  for (local_20 = uVar2; local_20 < (uint)(2 << ((byte)iVar1 & 0x1f)); local_20 = local_20 + 0x20) {
    node_05.depth = iVar1;
    node_05.id = local_20;
    uVar3 = leb__NodeBitID(leb,node_05);
    uVar4 = (leb->buffer[uVar3 >> 5] & 0x55555555) + (leb->buffer[uVar3 >> 5] >> 1 & 0x55555555);
    leb->buffer[uVar3 - uVar2 >> 5] = uVar4;
    uVar4 = (uVar4 & 0x33333333) + (uVar4 >> 2 & 0x33333333);
    node_04.depth = iVar1 + -2;
    node_04.id = local_20 >> 2;
    leb__HeapWriteExplicit
              (leb,node_04,0x18,
               uVar4 & 7 | uVar4 >> 1 & 0x38 | uVar4 >> 2 & 0x1c0 | uVar4 >> 3 & 0xe00 |
               uVar4 >> 4 & 0x7000 | uVar4 >> 5 & 0x38000 | uVar4 >> 6 & 0x1c0000 |
               uVar4 >> 7 & 0xe00000);
    uVar4 = (uVar4 & 0xf0f0f0f) + (uVar4 >> 4 & 0xf0f0f0f);
    node_03.depth = iVar1 + -3;
    node_03.id = local_20 >> 3;
    leb__HeapWriteExplicit
              (leb,node_03,0x10,
               uVar4 & 0xf | uVar4 >> 4 & 0xf0 | uVar4 >> 8 & 0xf00 | uVar4 >> 0xc & 0xf000);
    uVar4 = (uVar4 & 0xff00ff) + (uVar4 >> 8 & 0xff00ff);
    node_02.depth = iVar1 + -4;
    node_02.id = local_20 >> 4;
    leb__HeapWriteExplicit(leb,node_02,10,uVar4 & 0x1f | uVar4 >> 0xb);
    node_01.depth = iVar1 + -5;
    node_01.id = local_20 >> 5;
    leb__HeapWriteExplicit(leb,node_01,6,(uVar4 & 0xffff) + (uVar4 >> 0x10));
  }
  uVar3 = iVar1 - 5;
  while (maxNodeID = uVar3, uVar3 = maxNodeID - 1, -1 < (int)uVar3) {
    for (local_60 = 1 << ((byte)uVar3 & 0x1f); local_60 < (uint)(2 << ((byte)uVar3 & 0x1f));
        local_60 = local_60 + 1) {
      node_00.depth = maxNodeID;
      node_00.id = local_60 << 1;
      uVar5 = leb__HeapRead(leb,node_00);
      uVar6 = leb__HeapRead(leb,(leb_Node)(CONCAT44(maxNodeID,local_60 << 1) | 1));
      node.depth = uVar3;
      node.id = local_60;
      leb__HeapWrite(leb,node,uVar5 + uVar6);
    }
  }
  return;
}

Assistant:

LEBDEF void leb_ComputeSumReduction(leb_Heap *leb)
{
    int depth = leb->maxDepth;
    uint32_t minNodeID = (1u << depth);
    uint32_t maxNodeID = (2u << depth);

    // prepass: processes deepest levels in parallel
    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; nodeID+= 32u) {
        uint32_t alignedBitOffset = leb__NodeBitID(leb, {nodeID, depth});
        uint32_t bitField = leb->buffer[alignedBitOffset >> 5u];
        uint32_t bitData = 0u;

        // 2-bits
        bitField = (bitField & 0x55555555u) + ((bitField >> 1u) & 0x55555555u);
        bitData = bitField;
        leb->buffer[(alignedBitOffset - minNodeID) >> 5u] = bitData;

        // 3-bits
        bitField = (bitField & 0x33333333u) + ((bitField >>  2u) & 0x33333333u);
        bitData = ((bitField >> 0u) & (7u <<  0u))
                | ((bitField >> 1u) & (7u <<  3u))
                | ((bitField >> 2u) & (7u <<  6u))
                | ((bitField >> 3u) & (7u <<  9u))
                | ((bitField >> 4u) & (7u << 12u))
                | ((bitField >> 5u) & (7u << 15u))
                | ((bitField >> 6u) & (7u << 18u))
                | ((bitField >> 7u) & (7u << 21u));
        leb__HeapWriteExplicit(leb, {nodeID >> 2u, depth - 2}, 24u, bitData);

        // 4-bits
        bitField = (bitField & 0x0F0F0F0Fu) + ((bitField >>  4u) & 0x0F0F0F0Fu);
        bitData = ((bitField >>  0u) & (15u <<  0u))
                | ((bitField >>  4u) & (15u <<  4u))
                | ((bitField >>  8u) & (15u <<  8u))
                | ((bitField >> 12u) & (15u << 12u));
        leb__HeapWriteExplicit(leb, {nodeID >> 3u, depth - 3}, 16u, bitData);

        // 5-bits
        bitField = (bitField & 0x00FF00FFu) + ((bitField >>  8u) & 0x00FF00FFu);
        bitData = ((bitField >>  0u) & (31u << 0u))
                | ((bitField >> 11u) & (31u << 5u));
        leb__HeapWriteExplicit(leb, {nodeID >> 4u, depth - 4}, 10u, bitData);

        // 6-bits
        bitField = (bitField & 0x0000FFFFu) + ((bitField >> 16u) & 0x0000FFFFu);
        bitData = bitField;
        leb__HeapWriteExplicit(leb, {nodeID >> 5u, depth - 5},  6u, bitData);
    }
    depth-= 5;

    // iterate over elements atomically
    while (--depth >= 0) {
        uint32_t minNodeID = 1u << depth;
        uint32_t maxNodeID = 2u << depth;

        for (uint32_t j = minNodeID; j < maxNodeID; ++j) {
            uint32_t x0 = leb__HeapRead(leb, {j << 1u     , depth + 1});
            uint32_t x1 = leb__HeapRead(leb, {j << 1u | 1u, depth + 1});

            leb__HeapWrite(leb, {j, depth}, x0 + x1);
        }
    }
}